

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_base.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::
schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::insert_unknown_keyword
          (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,uri_wrapper *uri,string *key,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value)

{
  __normal_iterator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_*,_std::vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>_>
  __last;
  bool bVar1;
  json_type jVar2;
  __normal_iterator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_*,_std::vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>_>
  _Var3;
  undefined8 uVar4;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  uri_wrapper new_uri;
  uri_wrapper new_u;
  anchor_uri_map_type anchor_dict2;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Any_data local_468;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  pointer local_428;
  _Alloc_hider _Stack_420;
  unsigned_long local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_410;
  bool bStack_400;
  undefined3 uStack_3ff;
  undefined4 uStack_3fc;
  _Alloc_hider local_3f8;
  pointer local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  bool local_3d8;
  uri_wrapper local_3d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_318;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2e0;
  undefined1 local_2a8 [144];
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  bool local_1f8;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  local_138;
  void **local_120;
  void *local_110 [16];
  char local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uri_wrapper::append(&local_3d0,uri,key);
  local_488._0_8_ = &local_478;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_488,local_3d0.uri_.uri_string_._M_dataplus._M_p,
             local_3d0.uri_.uri_string_._M_dataplus._M_p +
             (long)(_Hash_node_base **)local_3d0.uri_.uri_string_._M_string_length);
  local_468._M_unused._M_object = (void *)local_3d0.uri_.scheme_part_.first;
  local_468._8_8_ = local_3d0.uri_.scheme_part_.second;
  local_458 = (undefined4)local_3d0.uri_.userinfo_part_.first;
  uStack_454 = local_3d0.uri_.userinfo_part_.first._4_4_;
  uStack_450 = (undefined4)local_3d0.uri_.userinfo_part_.second;
  uStack_44c = local_3d0.uri_.userinfo_part_.second._4_4_;
  local_448 = (undefined4)local_3d0.uri_.host_part_.first;
  uStack_444 = local_3d0.uri_.host_part_.first._4_4_;
  uStack_440 = (undefined4)local_3d0.uri_.host_part_.second;
  uStack_43c = local_3d0.uri_.host_part_.second._4_4_;
  local_438._M_allocated_capacity._0_4_ = (undefined4)local_3d0.uri_.port_part_.first;
  local_438._M_allocated_capacity._4_4_ = local_3d0.uri_.port_part_.first._4_4_;
  local_438._8_4_ = (undefined4)local_3d0.uri_.port_part_.second;
  local_438._12_4_ = local_3d0.uri_.port_part_.second._4_4_;
  local_428 = (pointer)local_3d0.uri_.path_part_.first;
  _Stack_420._M_p = (pointer)local_3d0.uri_.path_part_.second;
  local_418 = local_3d0.uri_.query_part_.first;
  aStack_410._M_allocated_capacity = local_3d0.uri_.query_part_.second;
  aStack_410._8_4_ = (undefined4)local_3d0.uri_.fragment_part_.first;
  aStack_410._12_4_ = local_3d0.uri_.fragment_part_.first._4_4_;
  bStack_400 = local_3d0.uri_.fragment_part_.second._0_1_;
  uStack_3ff = local_3d0.uri_.fragment_part_.second._1_3_;
  uStack_3fc = local_3d0.uri_.fragment_part_.second._4_4_;
  local_3f8._M_p = (pointer)&local_3e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,local_3d0.identifier_._M_dataplus._M_p,
             local_3d0.identifier_._M_dataplus._M_p + local_3d0.identifier_._M_string_length);
  local_3d8 = local_3d0.has_plain_name_fragment_;
  if ((CONCAT44(uStack_3fc,_bStack_400) != CONCAT44(aStack_410._12_4_,aStack_410._8_4_)) &&
     (local_3d0.has_plain_name_fragment_ == false)) {
    _Var3._M_current =
         (this->unresolved_refs_).
         super__Vector_base<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->unresolved_refs_).
         super__Vector_base<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2a8._0_8_ = local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,local_488._0_8_,(char *)(local_488._0_8_ + local_488._8_8_));
    local_2a8._32_8_ = local_468._M_unused._M_object;
    local_2a8._40_8_ = local_468._8_8_;
    local_2a8._48_8_ = CONCAT44(uStack_454,local_458);
    local_2a8._56_8_ = CONCAT44(uStack_44c,uStack_450);
    local_2a8._64_8_ = CONCAT44(uStack_444,local_448);
    local_2a8._72_8_ = CONCAT44(uStack_43c,uStack_440);
    local_2a8._80_8_ =
         CONCAT44(local_438._M_allocated_capacity._4_4_,local_438._M_allocated_capacity._0_4_);
    local_2a8._88_8_ = CONCAT44(local_438._12_4_,local_438._8_4_);
    local_2a8._96_8_ = local_428;
    local_2a8._104_8_ = _Stack_420._M_p;
    local_2a8._112_8_ = local_418;
    local_2a8._120_8_ = aStack_410._M_allocated_capacity;
    local_2a8._128_4_ = aStack_410._8_4_;
    local_2a8._132_4_ = aStack_410._12_4_;
    local_2a8._136_4_ = _bStack_400;
    local_2a8._140_4_ = uStack_3fc;
    local_498._8_8_ = this;
    local_218._M_p = (pointer)&local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_3f8._M_p,
               local_3f8._M_p + (long)&local_3f0->super__Function_base);
    local_1f8 = local_3d8;
    _Var3 = std::
            find_if<__gnu_cxx::__normal_iterator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>*,std::vector<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>,std::allocator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>>>>,jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::insert_unknown_keyword(jsoncons::jsonschema::uri_wrapper_const&,std::__cxx11::string_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&)::_lambda(std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*>const&)_1_>
                      (_Var3,__last,(anon_class_184_1_f15b012d_for__M_pred *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p != &local_208) {
      operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
    }
    uVar4 = local_498._8_8_;
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if (_Var3._M_current ==
        *(pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
          **)(uVar4 + 0x120)) {
      std::
      _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      _M_emplace_unique<jsoncons::uri_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)(uVar4 + 0x130),(uri *)local_488,value);
    }
    else {
      local_2e0._M_buckets = &local_2e0._M_single_bucket;
      local_2e0._M_bucket_count = 1;
      local_2e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2e0._M_element_count = 0;
      local_2e0._M_rehash_policy._M_max_load_factor = 1.0;
      local_2e0._M_rehash_policy._M_next_resize = 0;
      local_2e0._M_single_bucket = (__node_base_ptr)0x0;
      local_318._M_buckets = &local_318._M_single_bucket;
      local_318._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_318._M_element_count = 0;
      local_318._M_bucket_count = 1;
      local_318._M_rehash_policy._M_max_load_factor = 1.0;
      local_318._M_rehash_policy._4_4_ = 0;
      local_318._M_rehash_policy._M_next_resize = 0;
      local_318._M_single_bucket = (__node_base_ptr)0x0;
      compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::compilation_context
                ((compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)&local_1f0.common_,(uri_wrapper *)local_488,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_318);
      keys.size_ = 0;
      keys.data_ = (pointer)value;
      make_cross_draft_schema_validator
                ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_498,
                 (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)uVar4,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)&local_1f0.common_,keys,(anchor_uri_map_type *)0x0);
      std::
      vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
      ::
      emplace_back<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                ((vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  *)(uVar4 + 0x100),
                 (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  *)local_498);
      if ((tuple<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           )local_498._0_8_ !=
          (_Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
           )0x0) {
        (**(code **)((long)*(validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                             *)local_498._0_8_ + 8))();
      }
      local_498._0_8_ =
           (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_88);
      if ((local_90 == '\x01') && (local_90 = '\0', local_120 != local_110)) {
        operator_delete(local_120,(long)local_110[0] + 1);
      }
      std::
      vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
      ::~vector(&local_138);
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._0_8_ != local_1e0) {
        operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0[0]._M_allocated_capacity + 1));
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_318);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_2e0);
    }
    jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(value);
    if (jVar2 == object_value) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)&local_1f0.common_,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)value);
      bVar1 = local_1f0.short_str_.data_[6] == local_1e0[0]._M_local_buf[8];
      if ((local_1f0.short_str_.data_[6] & local_1e0[0]._M_local_buf[8] & 1U) != 0) {
        bVar1 = local_1f0._0_8_ == local_1e0[0]._M_allocated_capacity;
      }
      if (!bVar1) {
        uVar4 = local_1f0._0_8_;
        do {
          insert_unknown_keyword
                    ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)local_498._8_8_,(uri_wrapper *)local_488,(string *)uVar4,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     (uVar4 + 0x20));
          uVar4 = uVar4 + 0x30;
          bVar1 = uVar4 == local_1e0[0]._M_allocated_capacity;
          if ((local_1f0.short_str_.data_[6] & local_1e0[0]._M_local_buf[8] & 1U) == 0) {
            bVar1 = local_1f0.short_str_.data_[6] == local_1e0[0]._M_local_buf[8];
          }
        } while (!bVar1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_p != &local_3e8) {
    operator_delete(local_3f8._M_p,local_3e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._0_8_ != &local_478) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.identifier_._M_dataplus._M_p != &local_3d0.identifier_.field_2) {
    operator_delete(local_3d0.identifier_._M_dataplus._M_p,
                    local_3d0.identifier_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.uri_.uri_string_._M_dataplus._M_p != &local_3d0.uri_.uri_string_.field_2) {
    operator_delete(local_3d0.uri_.uri_string_._M_dataplus._M_p,
                    local_3d0.uri_.uri_string_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void insert_unknown_keyword(const uri_wrapper& uri, 
                                    const std::string& key, 
                                    const Json& value)
        {
            auto new_u = uri.append(key);
            uri_wrapper new_uri(new_u);

            if (new_uri.has_fragment() && !new_uri.has_plain_name_fragment()) 
            {
                // is there a reference looking for this unknown-keyword, which is thus no longer a unknown keyword but a schema
                auto unresolved_refs = std::find_if(this->unresolved_refs_.begin(), this->unresolved_refs_.end(),
                    [new_uri](const std::pair<jsoncons::uri,ref<Json>*>& pr) {return pr.first == new_uri.uri();});
                if (unresolved_refs != this->unresolved_refs_.end())
                {
                    anchor_uri_map_type anchor_dict2;
                    this->save_schema(make_cross_draft_schema_validator(compilation_context<Json>(new_uri), value, {}, anchor_dict2));
                }
                else // no, nothing ref'd it, keep for later
                {
                    //file.unknown_keywords.emplace(fragment, value);
                    this->unknown_keywords_.emplace(new_uri.uri(), value);
                }

                // recursively add possible subschemas of unknown keywords
                if (value.type() == json_type::object_value)
                {
                    for (const auto& subsch : value.object_range())
                    {
                        insert_unknown_keyword(new_uri, subsch.key(), subsch.value());
                    }
                }
            }
        }